

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

_Bool process_pref_file(char *name,_Bool quiet,_Bool user)

{
  byte local_16;
  _Bool local_15;
  byte local_14;
  _Bool local_13;
  byte local_12;
  byte local_11;
  _Bool used_fallback;
  _Bool user_success;
  _Bool root_success;
  _Bool user_local;
  char *pcStack_10;
  _Bool quiet_local;
  char *name_local;
  
  local_13 = false;
  local_14 = 0;
  local_15 = false;
  local_12 = user;
  local_11 = quiet;
  pcStack_10 = name;
  local_13 = process_pref_file_layered
                       (name,quiet,user,ANGBAND_DIR_CUSTOMIZE,ANGBAND_DIR_USER,&local_15);
  if ((!local_13) && (current_graphics_mode != (graphics_mode *)0x0)) {
    local_13 = process_pref_file_layered
                         (pcStack_10,(_Bool)(local_11 & 1),(_Bool)(local_12 & 1),
                          current_graphics_mode->path,(char *)0x0,(_Bool *)0x0);
  }
  if ((local_15 & 1U) == 0) {
    local_14 = process_pref_file_layered
                         (pcStack_10,true,true,ANGBAND_DIR_USER,(char *)0x0,&local_15);
  }
  local_16 = 1;
  if ((local_13 & 1U) == 0) {
    local_16 = local_14;
  }
  return (_Bool)(local_16 & 1);
}

Assistant:

bool process_pref_file(const char *name, bool quiet, bool user)
{
	bool root_success = false;
	bool user_success = false;
	bool used_fallback = false;

	/* This supports the old behavior: first load from lib/customize then
         * from the user location. */
	root_success = process_pref_file_layered(name, quiet, user,
											 ANGBAND_DIR_CUSTOMIZE,
											 ANGBAND_DIR_USER,
											 &used_fallback);

	/* If not found, do a check of the current graphics directory */
	if (!root_success && current_graphics_mode)
		root_success = process_pref_file_layered(name, quiet, user,
												 current_graphics_mode->path,
												 NULL, NULL);

	/* Next, we want to force a check for the file in the user location.
	 * However, since we used the user directory as a fallback in the previous
	 * check, we only want to do this if the fallback wasn't used. This cuts
	 * down on unnecessary parsing. */
	if (!used_fallback) {
		/* Force quiet (since this is an optional file) and force user
		 * (since this should always be considered user-specific). */
		user_success = process_pref_file_layered(name, true, true,
												 ANGBAND_DIR_USER, NULL,
												 &used_fallback);
	}

	/* If only one load was successful, that's okay; we loaded something. */
	return root_success || user_success;
}